

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void change_path(char *info)

{
  _Bool _Var1;
  wchar_t wVar2;
  char *__s;
  char *pcVar3;
  char *str;
  char local_238 [8];
  char dirpath [512];
  uint local_2c;
  uint i;
  char *dir;
  char *path;
  char *info_copy;
  char *info_local;
  
  if ((info == (char *)0x0) || (*info == '\0')) {
    quit_fmt("Try \'-d<dir>=<path>\'.");
  }
  __s = string_make(info);
  pcVar3 = strtok(__s,"=");
  str = strtok((char *)0x0,"=");
  local_2c = 0;
  while( true ) {
    if (0xc < local_2c) {
      quit_fmt("Unrecognised -d parameter %s",pcVar3);
      return;
    }
    wVar2 = my_stricmp(pcVar3,change_path_values[local_2c].name);
    if (wVar2 == L'\0') break;
    local_2c = local_2c + 1;
  }
  string_free(*change_path_values[local_2c].path);
  pcVar3 = string_make(str);
  *change_path_values[local_2c].path = pcVar3;
  path_build(local_238,0x200,str,"");
  _Var1 = dir_create(local_238);
  if (!_Var1) {
    quit_fmt("Cannot create \'%s\'",local_238);
  }
  string_free(__s);
  return;
}

Assistant:

static void change_path(const char *info)
{
	char *info_copy = NULL;
	char *path = NULL;
	char *dir = NULL;
	unsigned int i = 0;
	char dirpath[512];

	if (!info || !info[0])
		quit_fmt("Try '-d<dir>=<path>'.");

	info_copy = string_make(info);
	path = strtok(info_copy, "=");
	dir = strtok(NULL, "=");

	for (i = 0; i < N_ELEMENTS(change_path_values); i++) {
		if (my_stricmp(path, change_path_values[i].name) == 0) {
#ifdef SETGID
			if (!change_path_values[i].setgid_ok)
				quit_fmt("Can't redefine path to %s dir on multiuser setup",
						 path);
#endif

			string_free(*change_path_values[i].path);
			*change_path_values[i].path = string_make(dir);

			/* the directory may not exist and may need to be created. */
			path_build(dirpath, sizeof(dirpath), dir, "");
			if (!dir_create(dirpath)) quit_fmt("Cannot create '%s'", dirpath);
			string_free(info_copy);
			return;
		}
	}

	quit_fmt("Unrecognised -d parameter %s", path);
}